

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

optional<pbrt::CameraRay> * __thiscall
pbrt::SphericalCamera::GenerateRay
          (SphericalCamera *this,CameraSample sample,SampledWavelengths *lambda)

{
  Point2f uv_00;
  Point3f o;
  Point2f p;
  float *pfVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  float fVar2;
  Float FVar3;
  undefined1 auVar7 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  Vector3f VVar8;
  float in_stack_00000008;
  undefined4 in_stack_0000000c;
  Ray ray;
  Float phi;
  Float theta;
  Vector3f dir;
  Point2f uv;
  float in_stack_fffffffffffffe78;
  Float in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  CameraBase *in_stack_fffffffffffffe88;
  float fVar9;
  float fVar10;
  float phi_00;
  float cosTheta;
  Float in_stack_fffffffffffffea8;
  undefined4 uVar11;
  float fVar12;
  float fVar13;
  float in_stack_fffffffffffffec8;
  undefined8 local_3c;
  float local_34;
  Tuple2<pbrt::Point2,_int> local_30;
  Tuple2<pbrt::Point2,_int> local_28;
  undefined8 local_20;
  undefined1 auVar4 [64];
  undefined1 extraout_var [56];
  
  fVar9 = (float)in_RDI;
  fVar10 = (float)((ulong)in_RDI >> 0x20);
  fVar12 = (float)in_RSI;
  fVar13 = (float)((ulong)in_RSI >> 0x20);
  phi_00 = fVar9;
  cosTheta = fVar10;
  local_28 = (Tuple2<pbrt::Point2,_int>)
             Film::FullResolution
                       ((Film *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  fVar2 = in_stack_00000008 / (float)local_28.x;
  local_30 = (Tuple2<pbrt::Point2,_int>)
             Film::FullResolution
                       ((Film *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  Point2<float>::Point2
            ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
  Vector3<float>::Vector3((Vector3<float> *)0x727bfc);
  if (*(int *)(CONCAT44(fVar13,fVar12) + 0x380) == 0) {
    in_stack_fffffffffffffe88 = (CameraBase *)&stack0xffffffffffffffe0;
    pfVar1 = Tuple2<pbrt::Point2,_float>::operator[]
                       ((Tuple2<pbrt::Point2,_float> *)in_stack_fffffffffffffe88,1);
    fVar9 = *pfVar1;
    Tuple2<pbrt::Point2,_float>::operator[]
              ((Tuple2<pbrt::Point2,_float> *)in_stack_fffffffffffffe88,0);
    std::sin((double)(ulong)(uint)(fVar9 * 3.1415927));
    std::cos((double)(ulong)(uint)(fVar9 * 3.1415927));
    auVar7 = (undefined1  [56])0x0;
    VVar8 = SphericalDirection(in_stack_fffffffffffffea8,cosTheta,phi_00);
    local_34 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar4._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar7;
    local_3c = vmovlpd_avx(auVar4._0_16_);
    uVar11 = in_stack_0000000c;
  }
  else {
    uv_00.super_Tuple2<pbrt::Point2,_float>.y = fVar10;
    uv_00.super_Tuple2<pbrt::Point2,_float>.x = fVar9;
    auVar5._0_8_ = WrapEqualAreaSquare(uv_00);
    auVar5._8_56_ = extraout_var;
    local_20 = vmovlpd_avx(auVar5._0_16_);
    auVar7 = ZEXT856(0);
    p.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffec8;
    p.super_Tuple2<pbrt::Point2,_float>.x = fVar13;
    VVar8 = EqualAreaSquareToSphere(p);
    local_34 = VVar8.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar6._0_8_ = VVar8.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar6._8_56_ = auVar7;
    local_3c = vmovlpd_avx(auVar6._0_16_);
    uVar11 = in_stack_0000000c;
  }
  pstd::swap<float>((float *)((long)&local_3c + 4),&local_34);
  Point3<float>::Point3
            ((Point3<float> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,0.0);
  FVar3 = CameraBase::SampleTime
                    ((CameraBase *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     in_stack_fffffffffffffe7c);
  Medium::Medium((Medium *)CONCAT44(FVar3,in_stack_fffffffffffffe80),
                 (Medium *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  o.super_Tuple3<pbrt::Point3,_float>.y = fVar2;
  o.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar11;
  o.super_Tuple3<pbrt::Point3,_float>.z = fVar12;
  VVar8.super_Tuple3<pbrt::Vector3,_float>.y = phi_00;
  VVar8.super_Tuple3<pbrt::Vector3,_float>.x = fVar10;
  VVar8.super_Tuple3<pbrt::Vector3,_float>.z = cosTheta;
  Ray::Ray((Ray *)CONCAT44(FVar3,in_stack_fffffffffffffe80),o,VVar8,in_stack_fffffffffffffe7c,
           (Medium *)0x727e8d);
  CameraBase::RenderFromCamera
            (in_stack_fffffffffffffe88,(Ray *)CONCAT44(FVar3,in_stack_fffffffffffffe80));
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)CONCAT44(FVar3,in_stack_fffffffffffffe80),in_stack_fffffffffffffe7c)
  ;
  pstd::optional<pbrt::CameraRay>::optional
            ((optional<pbrt::CameraRay> *)CONCAT44(FVar3,in_stack_fffffffffffffe80),
             (CameraRay *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  return (optional<pbrt::CameraRay> *)CONCAT44(cosTheta,phi_00);
}

Assistant:

PBRT_CPU_GPU pstd::optional<CameraRay> SphericalCamera::GenerateRay(CameraSample sample,
                                                       SampledWavelengths &lambda) const {
    // Compute spherical camera ray direction
    Point2f uv(sample.pFilm.x / film.FullResolution().x,
               sample.pFilm.y / film.FullResolution().y);
    Vector3f dir;
    if (mapping == EquiRectangular) {
        // Compute ray direction using equirectangular mapping
        Float theta = Pi * uv[1], phi = 2 * Pi * uv[0];
        dir = SphericalDirection(std::sin(theta), std::cos(theta), phi);

    } else {
        // Compute ray direction using equal area mapping
        uv = WrapEqualAreaSquare(uv);
        dir = EqualAreaSquareToSphere(uv);
    }
    pstd::swap(dir.y, dir.z);

    Ray ray(Point3f(0, 0, 0), dir, SampleTime(sample.time), medium);
    return CameraRay{RenderFromCamera(ray)};
}